

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

ostream * operator<<(ostream *os,cmListFileContext *lfc)

{
  ostream *poVar1;
  char *pcVar2;
  
  std::operator<<(os,(string *)&lfc->FilePath);
  if (lfc->Line < 1) {
    if (lfc->Line != -1) {
      return os;
    }
    pcVar2 = ":DEFERRED";
    poVar1 = os;
  }
  else {
    poVar1 = std::operator<<(os,":");
    std::ostream::_M_insert<long>((long)poVar1);
    if ((lfc->Name)._M_string_length == 0) {
      return os;
    }
    poVar1 = std::operator<<(os," (");
    poVar1 = std::operator<<(poVar1,(string *)lfc);
    pcVar2 = ")";
  }
  std::operator<<(poVar1,pcVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, cmListFileContext const& lfc)
{
  os << lfc.FilePath;
  if (lfc.Line > 0) {
    os << ":" << lfc.Line;
    if (!lfc.Name.empty()) {
      os << " (" << lfc.Name << ")";
    }
  } else if (lfc.Line == cmListFileContext::DeferPlaceholderLine) {
    os << ":DEFERRED";
  }
  return os;
}